

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O2

void __thiscall
wasm::ModuleUtils::
ParallelFunctionAnalysis<wasm::(anonymous_namespace)::TNHInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
::doAnalysis(ParallelFunctionAnalysis<wasm::(anonymous_namespace)::TNHInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
             *this,Func *work)

{
  pointer puVar1;
  _Head_base<0UL,_wasm::Function_*,_false> __args;
  Module *pMVar2;
  ParallelFunctionAnalysis<wasm::(anonymous_namespace)::TNHInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  *pPVar3;
  mapped_type *__args_1;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar4;
  undefined1 local_2a8 [8];
  PassRunner runner;
  function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::TNHInfo_&)> local_58;
  ParallelFunctionAnalysis<wasm::(anonymous_namespace)::TNHInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  *local_38;
  
  puVar1 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = this;
  for (puVar4 = (this->wasm->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar3 = local_38, puVar4 != puVar1;
      puVar4 = puVar4 + 1) {
    __args._M_head_impl =
         (puVar4->_M_t).super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (*(char **)((long)&(__args._M_head_impl)->super_Importable + 0x20) != (char *)0x0) {
      runner._232_8_ = __args._M_head_impl;
      __args_1 = std::
                 map<wasm::Function_*,_wasm::(anonymous_namespace)::TNHInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::TNHInfo>_>_>
                 ::operator[](&this->map,(key_type *)&runner.isNested);
      std::function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::TNHInfo_&)>::operator()
                ((function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::TNHInfo_&)> *)work,
                 __args._M_head_impl,__args_1);
    }
  }
  PassRunner::PassRunner((PassRunner *)local_2a8,local_38->wasm);
  pMVar2 = pPVar3->wasm;
  std::function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::TNHInfo_&)>::function
            (&local_58,
             (function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::TNHInfo_&)> *)work);
  ParallelFunctionAnalysis<wasm::(anonymous_namespace)::TNHInfo,(wasm::Mutability)0,wasm::
  ModuleUtils::DefaultMap>::doAnalysis(std::function<void(wasm::Function*,wasm::
  (anonymous_namespace)::TNHInfo&)>)::Mapper::Mapper(wasm::Module&,std::map<wasm::Function*,wasm::
  (anonymous_namespace)::TNHInfo,std::less<wasm::Function*>,std::allocator<std::pair<wasm::
  Function*const,wasm::(anonymous_namespace)::TNHInfo>>>&,std::function<void(wasm::Function*,wasm::
  (anonymous)::TNHInfo__>_(&runner.isNested,pMVar2,&this->map,(Func *)&local_58);
  pMVar2 = pPVar3->wasm;
  Pass::setPassRunner((Pass *)&runner.isNested,(PassRunner *)local_2a8);
  (**(code **)(runner._232_8_ + 0x10))(&runner.isNested,pMVar2);
  doAnalysis::Mapper::~Mapper((Mapper *)&runner.isNested);
  std::_Function_base::~_Function_base(&local_58.super__Function_base);
  PassRunner::~PassRunner((PassRunner *)local_2a8);
  return;
}

Assistant:

void doAnalysis(Func work) {
    // Run on the imports first. TODO: parallelize this too
    for (auto& func : wasm.functions) {
      if (func->imported()) {
        work(func.get(), map[func.get()]);
      }
    }

    struct Mapper : public WalkerPass<PostWalker<Mapper>> {
      bool isFunctionParallel() override { return true; }
      bool modifiesBinaryenIR() override { return Mut; }

      Mapper(Module& module, Map& map, Func work)
        : module(module), map(map), work(work) {}

      std::unique_ptr<Pass> create() override {
        return std::make_unique<Mapper>(module, map, work);
      }

      void doWalkFunction(Function* curr) {
        assert(map.count(curr));
        work(curr, map[curr]);
      }

    private:
      Module& module;
      Map& map;
      Func work;
    };

    PassRunner runner(&wasm);
    Mapper(wasm, map, work).run(&runner, &wasm);
  }